

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  pointer plVar1;
  layer_creator_func p_Var2;
  pointer pBVar3;
  iterator __position;
  int *piVar4;
  void *__ptr;
  long *plVar5;
  Net *pNVar6;
  int iVar7;
  Layer *pLVar8;
  ulong uVar9;
  long lVar10;
  int bottom_blob_index;
  int top_count;
  int bottom_count;
  int typeindex;
  int blob_count;
  int layer_count;
  int magic;
  ParamDict pd;
  int local_964;
  int local_960;
  int local_95c;
  int local_958;
  uint local_954;
  int local_950;
  int local_94c;
  Net *local_948;
  int local_93c;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_938;
  ParamDict local_930;
  
  local_93c = 0;
  local_948 = this;
  iVar7 = (*dr->_vptr_DataReader[3])(dr,&local_93c,4);
  if (iVar7 == 4) {
    if (local_93c == 0x7685dd) {
      local_94c = 0;
      local_950 = 0;
      iVar7 = (*dr->_vptr_DataReader[3])(dr,&local_94c,4);
      if (iVar7 == 4) {
        iVar7 = (*dr->_vptr_DataReader[3])(dr,&local_950,4);
        pNVar6 = local_948;
        if (iVar7 == 4) {
          if ((0 < (long)local_94c) && (0 < local_950)) {
            local_938 = &local_948->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_938,(long)local_94c);
            this_00 = &pNVar6->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(this_00,(long)local_950);
            ParamDict::ParamDict(&local_930);
            local_960 = 0;
            if (0 < local_94c) {
              do {
                iVar7 = (*dr->_vptr_DataReader[3])(dr,&local_954,4);
                if (iVar7 != 4) {
                  load_param_bin();
LAB_001200b4:
                  iVar7 = -1;
                  goto LAB_001200b9;
                }
                iVar7 = (*dr->_vptr_DataReader[3])(dr,&local_958,4);
                if (iVar7 != 4) {
                  load_param_bin();
                  goto LAB_001200b4;
                }
                iVar7 = (*dr->_vptr_DataReader[3])(dr,&local_95c,4);
                if (iVar7 != 4) {
                  load_param_bin();
                  goto LAB_001200b4;
                }
                pLVar8 = create_layer(local_954);
                if (pLVar8 == (Layer *)0x0) {
                  uVar9 = (ulong)local_954;
                  if (-1 < (int)local_954) {
                    plVar1 = (local_948->custom_layer_registry).
                             super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    if (((int)(local_954 & 0xfffffeff) <
                         (int)((ulong)((long)(local_948->custom_layer_registry).
                                             super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)plVar1) >> 4)) &&
                       (p_Var2 = plVar1[local_954 & 0xfffffeff].creator,
                       p_Var2 != (layer_creator_func)0x0)) {
                      pLVar8 = (*p_Var2)();
                      if (pLVar8 != (Layer *)0x0) goto LAB_0011ff5a;
                      uVar9 = (ulong)local_954;
                    }
                  }
                  fprintf(_stderr,"layer %d not exists or registered\n",uVar9);
                  clear(local_948);
                  goto LAB_001200b4;
                }
LAB_0011ff5a:
                std::vector<int,_std::allocator<int>_>::resize(&pLVar8->bottoms,(long)local_958);
                if (0 < local_958) {
                  lVar10 = 0;
                  do {
                    iVar7 = (*dr->_vptr_DataReader[3])(dr,&local_964,4);
                    if (iVar7 != 4) {
                      load_param_bin();
                      goto LAB_001200b4;
                    }
                    pBVar3 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    __position._M_current =
                         pBVar3[local_964].consumers.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        pBVar3[local_964].consumers.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&pBVar3[local_964].consumers,
                                 __position,&local_960);
                    }
                    else {
                      *__position._M_current = local_960;
                      pBVar3[local_964].consumers.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                    }
                    (pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10] = local_964;
                    lVar10 = lVar10 + 1;
                  } while (lVar10 < local_958);
                }
                std::vector<int,_std::allocator<int>_>::resize(&pLVar8->tops,(long)local_95c);
                if (0 < local_95c) {
                  lVar10 = 0;
                  do {
                    iVar7 = (*dr->_vptr_DataReader[3])(dr,&local_964,4);
                    if (iVar7 != 4) {
                      load_param_bin();
                      goto LAB_001200b4;
                    }
                    (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                    super__Vector_impl_data._M_start[local_964].producer = local_960;
                    (pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10] = local_964;
                    lVar10 = lVar10 + 1;
                  } while (lVar10 < local_95c);
                }
                iVar7 = ParamDict::load_param_bin(&local_930,dr);
                if (iVar7 == 0) {
                  iVar7 = (*pLVar8->_vptr_Layer[2])(pLVar8,&local_930);
                  if (iVar7 == 0) {
                    (local_938->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[local_960] = pLVar8;
                  }
                  else {
                    load_param_bin();
                  }
                }
                else {
                  load_param_bin();
                }
                local_960 = local_960 + 1;
              } while (local_960 < local_94c);
            }
            iVar7 = 0;
LAB_001200b9:
            lVar10 = 0x8c0;
            do {
              piVar4 = *(int **)((long)&local_930.params[0].v.data + lVar10);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  __ptr = *(void **)((long)&local_930.params[0].type + lVar10);
                  plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar10);
                  if (plVar5 == (long *)0x0) {
                    if (__ptr != (void *)0x0) {
                      free(__ptr);
                    }
                  }
                  else {
                    (**(code **)(*plVar5 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar10 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar10 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].type + lVar10) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar10) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar10) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.dims + lVar10) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.h + lVar10) = 0;
              lVar10 = lVar10 + -0x48;
            } while (lVar10 != -0x40);
            return iVar7;
          }
          load_param_bin();
        }
        else {
          load_param_bin();
        }
      }
      else {
        load_param_bin();
      }
    }
    else {
      load_param_bin();
    }
  }
  else {
    load_param_bin();
  }
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf) \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    { \
        fprintf(stderr, "read " #buf " failed\n"); \
        return -1; \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        fprintf(stderr, "invalid layer_count or blob_count\n");
        return -1;
    }

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

#undef READ_VALUE
    return 0;
}